

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void duckdb_fastpforlib::internal::__fastunpack4(uint32_t *in,uint32_t *out)

{
  uint32_t inwordpointer;
  uint32_t outer;
  uint32_t *out_local;
  uint32_t *in_local;
  
  out_local = out;
  in_local = in;
  for (outer = 0; outer < 4; outer = outer + 1) {
    for (inwordpointer = 0; inwordpointer < 0x20; inwordpointer = inwordpointer + 4) {
      *out_local = *in_local >> ((byte)inwordpointer & 0x1f) & 0xf;
      out_local = out_local + 1;
    }
    in_local = in_local + 1;
  }
  return;
}

Assistant:

void __fastunpack4(const uint32_t *__restrict in, uint32_t *__restrict out) {
	for (uint32_t outer = 0; outer < 4; ++outer) {
		for (uint32_t inwordpointer = 0; inwordpointer < 32; inwordpointer += 4)
			*(out++) = ((*in) >> inwordpointer) % (1U << 4);
		++in;
	}
}